

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkFormat vk::mapTextureFormat(TextureFormat *format)

{
  ChannelType CVar1;
  InternalError *this;
  TextureFormat *format_local;
  
  CVar1 = format->order << 0x10 | format->type;
  if (CVar1 == SNORM_INT8) {
    format_local._4_4_ = VK_FORMAT_R8_SNORM;
  }
  else if (CVar1 == SNORM_INT16) {
    format_local._4_4_ = VK_FORMAT_R16_SNORM;
  }
  else if (CVar1 == UNORM_INT8) {
    format_local._4_4_ = VK_FORMAT_R8_UNORM;
  }
  else if (CVar1 == UNORM_INT16) {
    format_local._4_4_ = VK_FORMAT_R16_UNORM;
  }
  else if (CVar1 == SIGNED_INT8) {
    format_local._4_4_ = VK_FORMAT_R8_SINT;
  }
  else if (CVar1 == SIGNED_INT16) {
    format_local._4_4_ = VK_FORMAT_R16_SINT;
  }
  else if (CVar1 == SIGNED_INT32) {
    format_local._4_4_ = VK_FORMAT_R32_SINT;
  }
  else if (CVar1 == UNSIGNED_INT8) {
    format_local._4_4_ = VK_FORMAT_R8_UINT;
  }
  else if (CVar1 == UNSIGNED_INT16) {
    format_local._4_4_ = VK_FORMAT_R16_UINT;
  }
  else if (CVar1 == UNSIGNED_INT32) {
    format_local._4_4_ = VK_FORMAT_R32_UINT;
  }
  else if (CVar1 == HALF_FLOAT) {
    format_local._4_4_ = VK_FORMAT_R16_SFLOAT;
  }
  else if (CVar1 == FLOAT) {
    format_local._4_4_ = VK_FORMAT_R32_SFLOAT;
  }
  else if (CVar1 == FLOAT64) {
    format_local._4_4_ = VK_FORMAT_R64_SFLOAT;
  }
  else if (CVar1 == 0x50000) {
    format_local._4_4_ = VK_FORMAT_R8G8_SNORM;
  }
  else if (CVar1 == 0x50001) {
    format_local._4_4_ = VK_FORMAT_R16G16_SNORM;
  }
  else if (CVar1 == 0x50003) {
    format_local._4_4_ = VK_FORMAT_R8G8_UNORM;
  }
  else if (CVar1 == 0x50004) {
    format_local._4_4_ = VK_FORMAT_R16G16_UNORM;
  }
  else if (CVar1 == 0x50007) {
    format_local._4_4_ = VK_FORMAT_R4G4_UNORM_PACK8;
  }
  else if (CVar1 == 0x5001b) {
    format_local._4_4_ = VK_FORMAT_R8G8_SINT;
  }
  else if (CVar1 == 0x5001c) {
    format_local._4_4_ = VK_FORMAT_R16G16_SINT;
  }
  else if (CVar1 == 0x5001d) {
    format_local._4_4_ = VK_FORMAT_R32G32_SINT;
  }
  else if (CVar1 == 0x5001e) {
    format_local._4_4_ = VK_FORMAT_R8G8_UINT;
  }
  else if (CVar1 == 0x5001f) {
    format_local._4_4_ = VK_FORMAT_R16G16_UINT;
  }
  else if (CVar1 == 0x50021) {
    format_local._4_4_ = VK_FORMAT_R32G32_UINT;
  }
  else if (CVar1 == 0x50022) {
    format_local._4_4_ = VK_FORMAT_R16G16_SFLOAT;
  }
  else if (CVar1 == 0x50023) {
    format_local._4_4_ = VK_FORMAT_R32G32_SFLOAT;
  }
  else if (CVar1 == 0x50024) {
    format_local._4_4_ = VK_FORMAT_R64G64_SFLOAT;
  }
  else if (CVar1 == 0x70000) {
    format_local._4_4_ = VK_FORMAT_R8G8B8_SNORM;
  }
  else if (CVar1 == 0x70001) {
    format_local._4_4_ = VK_FORMAT_R16G16B16_SNORM;
  }
  else if (CVar1 == 0x70003) {
    format_local._4_4_ = VK_FORMAT_R8G8B8_UNORM;
  }
  else if (CVar1 == 0x70004) {
    format_local._4_4_ = VK_FORMAT_R16G16B16_UNORM;
  }
  else if (CVar1 == 0x70008) {
    format_local._4_4_ = VK_FORMAT_R5G6B5_UNORM_PACK16;
  }
  else if (CVar1 == 0x70016) {
    format_local._4_4_ = VK_FORMAT_B10G11R11_UFLOAT_PACK32;
  }
  else if (CVar1 == 0x70017) {
    format_local._4_4_ = VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
  }
  else if (CVar1 == 0x7001b) {
    format_local._4_4_ = VK_FORMAT_R8G8B8_SINT;
  }
  else if (CVar1 == 0x7001c) {
    format_local._4_4_ = VK_FORMAT_R16G16B16_SINT;
  }
  else if (CVar1 == 0x7001d) {
    format_local._4_4_ = VK_FORMAT_R32G32B32_SINT;
  }
  else if (CVar1 == 0x7001e) {
    format_local._4_4_ = VK_FORMAT_R8G8B8_UINT;
  }
  else if (CVar1 == 0x7001f) {
    format_local._4_4_ = VK_FORMAT_R16G16B16_UINT;
  }
  else if (CVar1 == 0x70021) {
    format_local._4_4_ = VK_FORMAT_R32G32B32_UINT;
  }
  else if (CVar1 == 0x70022) {
    format_local._4_4_ = VK_FORMAT_R16G16B16_SFLOAT;
  }
  else if (CVar1 == 0x70023) {
    format_local._4_4_ = VK_FORMAT_R32G32B32_SFLOAT;
  }
  else if (CVar1 == 0x70024) {
    format_local._4_4_ = VK_FORMAT_R64G64B64_SFLOAT;
  }
  else if (CVar1 == 0x80000) {
    format_local._4_4_ = VK_FORMAT_R8G8B8A8_SNORM;
  }
  else if (CVar1 == 0x80001) {
    format_local._4_4_ = VK_FORMAT_R16G16B16A16_SNORM;
  }
  else if (CVar1 == 0x80003) {
    format_local._4_4_ = VK_FORMAT_R8G8B8A8_UNORM;
  }
  else if (CVar1 == 0x80004) {
    format_local._4_4_ = VK_FORMAT_R16G16B16A16_UNORM;
  }
  else if (CVar1 == 0x8000a) {
    format_local._4_4_ = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  }
  else if (CVar1 == 0x8000b) {
    format_local._4_4_ = VK_FORMAT_R5G5B5A1_UNORM_PACK16;
  }
  else if (CVar1 == 0x8000e) {
    format_local._4_4_ = VK_FORMAT_A2B10G10R10_SNORM_PACK32;
  }
  else if (CVar1 == 0x8000f) {
    format_local._4_4_ = VK_FORMAT_A2B10G10R10_UNORM_PACK32;
  }
  else if (CVar1 == 0x80014) {
    format_local._4_4_ = VK_FORMAT_A2B10G10R10_SINT_PACK32;
  }
  else if (CVar1 == 0x80015) {
    format_local._4_4_ = VK_FORMAT_A2B10G10R10_UINT_PACK32;
  }
  else if (CVar1 == 0x8001b) {
    format_local._4_4_ = VK_FORMAT_R8G8B8A8_SINT;
  }
  else if (CVar1 == 0x8001c) {
    format_local._4_4_ = VK_FORMAT_R16G16B16A16_SINT;
  }
  else if (CVar1 == 0x8001d) {
    format_local._4_4_ = VK_FORMAT_R32G32B32A32_SINT;
  }
  else if (CVar1 == 0x8001e) {
    format_local._4_4_ = VK_FORMAT_R8G8B8A8_UINT;
  }
  else if (CVar1 == 0x8001f) {
    format_local._4_4_ = VK_FORMAT_R16G16B16A16_UINT;
  }
  else if (CVar1 == 0x80021) {
    format_local._4_4_ = VK_FORMAT_R32G32B32A32_UINT;
  }
  else if (CVar1 == 0x80022) {
    format_local._4_4_ = VK_FORMAT_R16G16B16A16_SFLOAT;
  }
  else if (CVar1 == 0x80023) {
    format_local._4_4_ = VK_FORMAT_R32G32B32A32_SFLOAT;
  }
  else if (CVar1 == 0x80024) {
    format_local._4_4_ = VK_FORMAT_R64G64B64A64_SFLOAT;
  }
  else if (CVar1 == 0x9000c) {
    format_local._4_4_ = VK_FORMAT_A1R5G5B5_UNORM_PACK16;
  }
  else if (CVar1 == 0xa0000) {
    format_local._4_4_ = VK_FORMAT_B8G8R8_SNORM;
  }
  else if (CVar1 == 0xa0003) {
    format_local._4_4_ = VK_FORMAT_B8G8R8_UNORM;
  }
  else if (CVar1 == 0xa0008) {
    format_local._4_4_ = VK_FORMAT_B5G6R5_UNORM_PACK16;
  }
  else if (CVar1 == 0xa001b) {
    format_local._4_4_ = VK_FORMAT_B8G8R8_SINT;
  }
  else if (CVar1 == 0xa001e) {
    format_local._4_4_ = VK_FORMAT_B8G8R8_UINT;
  }
  else if (CVar1 == 0xb0000) {
    format_local._4_4_ = VK_FORMAT_B8G8R8A8_SNORM;
  }
  else if (CVar1 == 0xb0003) {
    format_local._4_4_ = VK_FORMAT_B8G8R8A8_UNORM;
  }
  else if (CVar1 == 0xb000a) {
    format_local._4_4_ = VK_FORMAT_B4G4R4A4_UNORM_PACK16;
  }
  else if (CVar1 == 0xb000b) {
    format_local._4_4_ = VK_FORMAT_B5G5R5A1_UNORM_PACK16;
  }
  else if (CVar1 == 0xb000e) {
    format_local._4_4_ = VK_FORMAT_A2R10G10B10_SNORM_PACK32;
  }
  else if (CVar1 == 0xb000f) {
    format_local._4_4_ = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
  }
  else if (CVar1 == 0xb0014) {
    format_local._4_4_ = VK_FORMAT_A2R10G10B10_SINT_PACK32;
  }
  else if (CVar1 == 0xb0015) {
    format_local._4_4_ = VK_FORMAT_A2R10G10B10_UINT_PACK32;
  }
  else if (CVar1 == 0xb001b) {
    format_local._4_4_ = VK_FORMAT_B8G8R8A8_SINT;
  }
  else if (CVar1 == 0xb001e) {
    format_local._4_4_ = VK_FORMAT_B8G8R8A8_UINT;
  }
  else if (CVar1 == 0xc0003) {
    format_local._4_4_ = VK_FORMAT_R8_SRGB;
  }
  else if (CVar1 == 0xd0003) {
    format_local._4_4_ = VK_FORMAT_R8G8_SRGB;
  }
  else if (CVar1 == 0xe0003) {
    format_local._4_4_ = VK_FORMAT_R8G8B8_SRGB;
  }
  else if (CVar1 == 0xf0003) {
    format_local._4_4_ = VK_FORMAT_R8G8B8A8_SRGB;
  }
  else if (CVar1 == 0x100003) {
    format_local._4_4_ = VK_FORMAT_B8G8R8_SRGB;
  }
  else if (CVar1 == 0x110003) {
    format_local._4_4_ = VK_FORMAT_B8G8R8A8_SRGB;
  }
  else if (CVar1 == 0x120004) {
    format_local._4_4_ = VK_FORMAT_D16_UNORM;
  }
  else if (CVar1 == 0x12001a) {
    format_local._4_4_ = VK_FORMAT_X8_D24_UNORM_PACK32;
  }
  else if (CVar1 == 0x120023) {
    format_local._4_4_ = VK_FORMAT_D32_SFLOAT;
  }
  else if (CVar1 == 0x13001e) {
    format_local._4_4_ = VK_FORMAT_S8_UINT;
  }
  else if (CVar1 == 0x140018) {
    format_local._4_4_ = VK_FORMAT_D16_UNORM_S8_UINT;
  }
  else if (CVar1 == 0x14001a) {
    format_local._4_4_ = VK_FORMAT_D24_UNORM_S8_UINT;
  }
  else {
    if (CVar1 != 0x140025) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,"Unknown texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                 ,0x14d);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    format_local._4_4_ = VK_FORMAT_D32_SFLOAT_S8_UINT;
  }
  return format_local._4_4_;
}

Assistant:

VkFormat mapTextureFormat (const tcu::TextureFormat& format)
{
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELORDER_LAST < (1<<16));
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELTYPE_LAST < (1<<16));

#define PACK_FMT(ORDER, TYPE) ((int(ORDER) << 16) | int(TYPE))
#define FMT_CASE(ORDER, TYPE) PACK_FMT(tcu::TextureFormat::ORDER, tcu::TextureFormat::TYPE)

	// update this mapping if VkFormat changes
	DE_STATIC_ASSERT(VK_CORE_FORMAT_LAST == 185);

	switch (PACK_FMT(format.order, format.type))
	{
		case FMT_CASE(RG, UNORM_BYTE_44):					return VK_FORMAT_R4G4_UNORM_PACK8;
		case FMT_CASE(RGB, UNORM_SHORT_565):				return VK_FORMAT_R5G6B5_UNORM_PACK16;
		case FMT_CASE(RGBA, UNORM_SHORT_4444):				return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
		case FMT_CASE(RGBA, UNORM_SHORT_5551):				return VK_FORMAT_R5G5B5A1_UNORM_PACK16;

		case FMT_CASE(BGR, UNORM_SHORT_565):				return VK_FORMAT_B5G6R5_UNORM_PACK16;
		case FMT_CASE(BGRA, UNORM_SHORT_4444):				return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
		case FMT_CASE(BGRA, UNORM_SHORT_5551):				return VK_FORMAT_B5G5R5A1_UNORM_PACK16;

		case FMT_CASE(ARGB, UNORM_SHORT_1555):				return VK_FORMAT_A1R5G5B5_UNORM_PACK16;

		case FMT_CASE(R, UNORM_INT8):						return VK_FORMAT_R8_UNORM;
		case FMT_CASE(R, SNORM_INT8):						return VK_FORMAT_R8_SNORM;
		case FMT_CASE(R, UNSIGNED_INT8):					return VK_FORMAT_R8_UINT;
		case FMT_CASE(R, SIGNED_INT8):						return VK_FORMAT_R8_SINT;
		case FMT_CASE(sR, UNORM_INT8):						return VK_FORMAT_R8_SRGB;

		case FMT_CASE(RG, UNORM_INT8):						return VK_FORMAT_R8G8_UNORM;
		case FMT_CASE(RG, SNORM_INT8):						return VK_FORMAT_R8G8_SNORM;
		case FMT_CASE(RG, UNSIGNED_INT8):					return VK_FORMAT_R8G8_UINT;
		case FMT_CASE(RG, SIGNED_INT8):						return VK_FORMAT_R8G8_SINT;
		case FMT_CASE(sRG, UNORM_INT8):						return VK_FORMAT_R8G8_SRGB;

		case FMT_CASE(RGB, UNORM_INT8):						return VK_FORMAT_R8G8B8_UNORM;
		case FMT_CASE(RGB, SNORM_INT8):						return VK_FORMAT_R8G8B8_SNORM;
		case FMT_CASE(RGB, UNSIGNED_INT8):					return VK_FORMAT_R8G8B8_UINT;
		case FMT_CASE(RGB, SIGNED_INT8):					return VK_FORMAT_R8G8B8_SINT;
		case FMT_CASE(sRGB, UNORM_INT8):					return VK_FORMAT_R8G8B8_SRGB;

		case FMT_CASE(RGBA, UNORM_INT8):					return VK_FORMAT_R8G8B8A8_UNORM;
		case FMT_CASE(RGBA, SNORM_INT8):					return VK_FORMAT_R8G8B8A8_SNORM;
		case FMT_CASE(RGBA, UNSIGNED_INT8):					return VK_FORMAT_R8G8B8A8_UINT;
		case FMT_CASE(RGBA, SIGNED_INT8):					return VK_FORMAT_R8G8B8A8_SINT;
		case FMT_CASE(sRGBA, UNORM_INT8):					return VK_FORMAT_R8G8B8A8_SRGB;

		case FMT_CASE(RGBA, UNORM_INT_1010102_REV):			return VK_FORMAT_A2B10G10R10_UNORM_PACK32;
		case FMT_CASE(RGBA, SNORM_INT_1010102_REV):			return VK_FORMAT_A2B10G10R10_SNORM_PACK32;
		case FMT_CASE(RGBA, UNSIGNED_INT_1010102_REV):		return VK_FORMAT_A2B10G10R10_UINT_PACK32;
		case FMT_CASE(RGBA, SIGNED_INT_1010102_REV):		return VK_FORMAT_A2B10G10R10_SINT_PACK32;

		case FMT_CASE(R, UNORM_INT16):						return VK_FORMAT_R16_UNORM;
		case FMT_CASE(R, SNORM_INT16):						return VK_FORMAT_R16_SNORM;
		case FMT_CASE(R, UNSIGNED_INT16):					return VK_FORMAT_R16_UINT;
		case FMT_CASE(R, SIGNED_INT16):						return VK_FORMAT_R16_SINT;
		case FMT_CASE(R, HALF_FLOAT):						return VK_FORMAT_R16_SFLOAT;

		case FMT_CASE(RG, UNORM_INT16):						return VK_FORMAT_R16G16_UNORM;
		case FMT_CASE(RG, SNORM_INT16):						return VK_FORMAT_R16G16_SNORM;
		case FMT_CASE(RG, UNSIGNED_INT16):					return VK_FORMAT_R16G16_UINT;
		case FMT_CASE(RG, SIGNED_INT16):					return VK_FORMAT_R16G16_SINT;
		case FMT_CASE(RG, HALF_FLOAT):						return VK_FORMAT_R16G16_SFLOAT;

		case FMT_CASE(RGB, UNORM_INT16):					return VK_FORMAT_R16G16B16_UNORM;
		case FMT_CASE(RGB, SNORM_INT16):					return VK_FORMAT_R16G16B16_SNORM;
		case FMT_CASE(RGB, UNSIGNED_INT16):					return VK_FORMAT_R16G16B16_UINT;
		case FMT_CASE(RGB, SIGNED_INT16):					return VK_FORMAT_R16G16B16_SINT;
		case FMT_CASE(RGB, HALF_FLOAT):						return VK_FORMAT_R16G16B16_SFLOAT;

		case FMT_CASE(RGBA, UNORM_INT16):					return VK_FORMAT_R16G16B16A16_UNORM;
		case FMT_CASE(RGBA, SNORM_INT16):					return VK_FORMAT_R16G16B16A16_SNORM;
		case FMT_CASE(RGBA, UNSIGNED_INT16):				return VK_FORMAT_R16G16B16A16_UINT;
		case FMT_CASE(RGBA, SIGNED_INT16):					return VK_FORMAT_R16G16B16A16_SINT;
		case FMT_CASE(RGBA, HALF_FLOAT):					return VK_FORMAT_R16G16B16A16_SFLOAT;

		case FMT_CASE(R, UNSIGNED_INT32):					return VK_FORMAT_R32_UINT;
		case FMT_CASE(R, SIGNED_INT32):						return VK_FORMAT_R32_SINT;
		case FMT_CASE(R, FLOAT):							return VK_FORMAT_R32_SFLOAT;

		case FMT_CASE(RG, UNSIGNED_INT32):					return VK_FORMAT_R32G32_UINT;
		case FMT_CASE(RG, SIGNED_INT32):					return VK_FORMAT_R32G32_SINT;
		case FMT_CASE(RG, FLOAT):							return VK_FORMAT_R32G32_SFLOAT;

		case FMT_CASE(RGB, UNSIGNED_INT32):					return VK_FORMAT_R32G32B32_UINT;
		case FMT_CASE(RGB, SIGNED_INT32):					return VK_FORMAT_R32G32B32_SINT;
		case FMT_CASE(RGB, FLOAT):							return VK_FORMAT_R32G32B32_SFLOAT;

		case FMT_CASE(RGBA, UNSIGNED_INT32):				return VK_FORMAT_R32G32B32A32_UINT;
		case FMT_CASE(RGBA, SIGNED_INT32):					return VK_FORMAT_R32G32B32A32_SINT;
		case FMT_CASE(RGBA, FLOAT):							return VK_FORMAT_R32G32B32A32_SFLOAT;

		case FMT_CASE(R, FLOAT64):							return VK_FORMAT_R64_SFLOAT;
		case FMT_CASE(RG, FLOAT64):							return VK_FORMAT_R64G64_SFLOAT;
		case FMT_CASE(RGB, FLOAT64):						return VK_FORMAT_R64G64B64_SFLOAT;
		case FMT_CASE(RGBA, FLOAT64):						return VK_FORMAT_R64G64B64A64_SFLOAT;

		case FMT_CASE(RGB, UNSIGNED_INT_11F_11F_10F_REV):	return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
		case FMT_CASE(RGB, UNSIGNED_INT_999_E5_REV):		return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;

		case FMT_CASE(BGR, UNORM_INT8):						return VK_FORMAT_B8G8R8_UNORM;
		case FMT_CASE(BGR, SNORM_INT8):						return VK_FORMAT_B8G8R8_SNORM;
		case FMT_CASE(BGR, UNSIGNED_INT8):					return VK_FORMAT_B8G8R8_UINT;
		case FMT_CASE(BGR, SIGNED_INT8):					return VK_FORMAT_B8G8R8_SINT;
		case FMT_CASE(sBGR, UNORM_INT8):					return VK_FORMAT_B8G8R8_SRGB;

		case FMT_CASE(BGRA, UNORM_INT8):					return VK_FORMAT_B8G8R8A8_UNORM;
		case FMT_CASE(BGRA, SNORM_INT8):					return VK_FORMAT_B8G8R8A8_SNORM;
		case FMT_CASE(BGRA, UNSIGNED_INT8):					return VK_FORMAT_B8G8R8A8_UINT;
		case FMT_CASE(BGRA, SIGNED_INT8):					return VK_FORMAT_B8G8R8A8_SINT;
		case FMT_CASE(sBGRA, UNORM_INT8):					return VK_FORMAT_B8G8R8A8_SRGB;

		case FMT_CASE(BGRA, UNORM_INT_1010102_REV):			return VK_FORMAT_A2R10G10B10_UNORM_PACK32;
		case FMT_CASE(BGRA, SNORM_INT_1010102_REV):			return VK_FORMAT_A2R10G10B10_SNORM_PACK32;
		case FMT_CASE(BGRA, UNSIGNED_INT_1010102_REV):		return VK_FORMAT_A2R10G10B10_UINT_PACK32;
		case FMT_CASE(BGRA, SIGNED_INT_1010102_REV):		return VK_FORMAT_A2R10G10B10_SINT_PACK32;

		case FMT_CASE(D, UNORM_INT16):						return VK_FORMAT_D16_UNORM;
		case FMT_CASE(D, UNSIGNED_INT_24_8_REV):			return VK_FORMAT_X8_D24_UNORM_PACK32;
		case FMT_CASE(D, FLOAT):							return VK_FORMAT_D32_SFLOAT;

		case FMT_CASE(S, UNSIGNED_INT8):					return VK_FORMAT_S8_UINT;

		case FMT_CASE(DS, UNSIGNED_INT_16_8_8):				return VK_FORMAT_D16_UNORM_S8_UINT;
		case FMT_CASE(DS, UNSIGNED_INT_24_8_REV):			return VK_FORMAT_D24_UNORM_S8_UINT;
		case FMT_CASE(DS, FLOAT_UNSIGNED_INT_24_8_REV):		return VK_FORMAT_D32_SFLOAT_S8_UINT;

		default:
			TCU_THROW(InternalError, "Unknown texture format");
	}

#undef PACK_FMT
#undef FMT_CASE
}